

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DPolyobjInterpolation::DPolyobjInterpolation(DPolyobjInterpolation *this,FPolyObj *po)

{
  uint uVar1;
  FPolyObj *po_local;
  DPolyobjInterpolation *this_local;
  
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00b8bcf0;
  TArray<double,_double>::TArray(&this->oldverts);
  TArray<double,_double>::TArray(&this->bakverts);
  this->poly = po;
  uVar1 = TArray<vertex_t_*,_vertex_t_*>::Size(&po->Vertices);
  TArray<double,_double>::Resize(&this->oldverts,uVar1 * 2);
  uVar1 = TArray<vertex_t_*,_vertex_t_*>::Size(&po->Vertices);
  TArray<double,_double>::Resize(&this->bakverts,uVar1 * 2);
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])();
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DPolyobjInterpolation::DPolyobjInterpolation(FPolyObj *po)
{
	poly = po;
	oldverts.Resize(po->Vertices.Size() << 1);
	bakverts.Resize(po->Vertices.Size() << 1);
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}